

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::
createApply<deqp::gls::BuiltinPrecisionTests::Signature<float,tcu::Vector<float,3>,int,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (BuiltinPrecisionTests *this,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_3>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func,ExprP<tcu::Vector<float,_3>_> *arg0,ExprP<int> *arg1,
          ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg2,
          ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_3>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  ExprP<float> EVar1;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg3_local;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg2_local;
  ExprP<int> *arg1_local;
  ExprP<tcu::Vector<float,_3>_> *arg0_local;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_3>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *func_local;
  
  this_00 = (Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_3>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
             *)operator_new(0x50);
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_3>,_int,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Apply(this_00,func,arg0,arg1,arg2,arg3);
  EVar1 = exprP<float>(this,(Expr<float> *)this_00);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}